

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O2

void __thiscall
UniversalTest_SingleUniversal_Test_Test::TestBody(UniversalTest_SingleUniversal_Test_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  HeapType HVar4;
  result_type rVar5;
  ostream *poVar6;
  char *in_R9;
  long lVar7;
  bool bVar8;
  AssertionResult gtest_ar_;
  AssertHelper local_1440;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1438;
  vector<int,_std::allocator<int>_> values;
  HeapList tested;
  FoolHeapList fool;
  string local_13d8;
  mt19937 generator;
  
  rVar5 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&generator,rVar5);
  std::vector<int,_std::allocator<int>_>::vector(&values,1000000,(allocator_type *)&tested);
  for (lVar7 = 0; lVar7 != 1000000; lVar7 = lVar7 + 1) {
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&generator);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = (int)rVar5;
  }
  for (HVar4 = Binomial; HVar4 != Fool; HVar4 = HVar4 + Leftist) {
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fool.super_HeapList.TYPE = Fool;
    tested.TYPE = HVar4;
    HeapList::AddHeap(&tested,*values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
    HeapList::AddHeap(&fool.super_HeapList,
                      *values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    poVar6 = std::operator<<((ostream *)&std::cout,"Size ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    for (lVar7 = 1; lVar7 != 1000000; lVar7 = lVar7 + 1) {
      (**(*tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)
                (*tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 (ulong)(uint)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar7]);
      (**(*fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)();
      iVar1 = (*(*tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->_vptr_IHeap[1])();
      iVar2 = (*(*fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->_vptr_IHeap[1])();
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = iVar1 == iVar2;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_1438);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_13d8,(internal *)&gtest_ar_,
                   (AssertionResult *)"tested.GetMin(0) == fool.GetMin(0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x1d,local_13d8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_1440,(Message *)&local_1438);
        testing::internal::AssertHelper::~AssertHelper(&local_1440);
        std::__cxx11::string::~string((string *)&local_13d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_1438);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    iVar1 = 1000000;
    while (bVar8 = iVar1 != 0, iVar1 = iVar1 + -1, bVar8) {
      iVar2 = HeapList::ExtractMin(&tested,0);
      iVar3 = HeapList::ExtractMin(&fool.super_HeapList,0);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = iVar2 == iVar3;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_1438);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_13d8,(internal *)&gtest_ar_,
                   (AssertionResult *)"tested.ExtractMin(0) == fool.ExtractMin(0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0x21,local_13d8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_1440,(Message *)&local_1438);
        testing::internal::AssertHelper::~AssertHelper(&local_1440);
        std::__cxx11::string::~string((string *)&local_13d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_1438);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    HeapList::~HeapList(&fool.super_HeapList);
    HeapList::~HeapList(&tested);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(UniversalTest, SingleUniversal_Test) {
    std::mt19937 generator(time(0));
    const size_t size = 1000000;
    std::vector<int> values(size);
    for (int i = 0; i < size; i++) {
        values[i] = generator();
    }

    for (int type = 0; type < 3; type++) {
        HeapList tested(type);
        FoolHeapList fool;

        tested.AddHeap(values[0]);
        fool.AddHeap(values[0]);
        std::cout << "Size " << size << std::endl;

        for (int i = 0; i < size - 1; i++) {
            tested.Insert(0, values[i + 1]);
            fool.Insert(0, values[i + 1]);
            EXPECT_TRUE(tested.GetMin(0) == fool.GetMin(0));
        }

        for (int i = 0; i < size; i++) {
            EXPECT_TRUE(tested.ExtractMin(0) == fool.ExtractMin(0));
        }
    }
}